

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O3

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::ReceiveGarbage(V2TransportTester *this)

{
  pointer puVar1;
  long lVar2;
  pointer puVar3;
  ptrdiff_t _Num;
  size_t __n;
  iterator in_R9;
  pointer __src;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar4;
  long local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = 0;
  do {
    msg.m_begin = &local_48;
    local_48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_40 = "";
    local_58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_50 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x4e1;
    file.m_begin = (iterator)msg.m_begin;
    msg.m_end = in_R9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (local_b8 + 0x10U <=
         (ulong)((long)(this->m_received).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->m_received).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start));
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "m_received.size() >= garblen + BIP324Cipher::GARBAGE_TERMINATOR_LEN";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_a8 = "";
    in_R9 = (iterator)0x0;
    local_78 = &local_a0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,2,0,WARN,_cVar4,(size_t)&local_b0,0x4e1);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    puVar1 = (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar2 = 0;
    while (puVar1[lVar2 + local_b8] == (this->m_cipher).m_recv_garbage_terminator._M_elems[lVar2]) {
      lVar2 = lVar2 + 1;
      if (lVar2 == 0x10) goto LAB_004d0460;
    }
    local_b8 = local_b8 + 1;
  } while (local_b8 != 0x1000);
  local_b8 = 0x1000;
LAB_004d0460:
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_recv_garbage,puVar1,
             puVar1 + local_b8);
  puVar1 = (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __src = puVar1 + local_b8 + 0x10;
  __n = (long)(this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  puVar3 = __src;
  if (__n != 0) {
    memmove(puVar1,__src,__n);
    puVar3 = (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar3 != puVar1 + ((long)puVar3 - (long)__src)) {
    (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1 + ((long)puVar3 - (long)__src);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ReceiveGarbage()
    {
        // Figure out the garbage length.
        size_t garblen;
        for (garblen = 0; garblen <= V2Transport::MAX_GARBAGE_LEN; ++garblen) {
            BOOST_REQUIRE(m_received.size() >= garblen + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
            auto term_span = MakeByteSpan(Span{m_received}.subspan(garblen, BIP324Cipher::GARBAGE_TERMINATOR_LEN));
            if (std::ranges::equal(term_span, m_cipher.GetReceiveGarbageTerminator())) break;
        }
        // Copy the garbage to a buffer.
        m_recv_garbage.assign(m_received.begin(), m_received.begin() + garblen);
        // Strip garbage + garbage terminator off the front of the receive buffer.
        m_received.erase(m_received.begin(), m_received.begin() + garblen + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
    }